

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Template.hpp
# Opt level: O2

void Qentem::TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::
     parseLoopAttributes(char *content,SizeT end_offset,LoopTag *tag)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  SizeT SVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  byte bVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  undefined4 local_48;
  int local_40;
  
  uVar9 = (ulong)end_offset;
  local_48 = 0;
  local_40 = end_offset - 4;
  uVar14 = tag->Offset + 5;
  do {
    for (uVar12 = (ulong)uVar14; uVar12 < uVar9; uVar12 = uVar12 + 1) {
      cVar1 = content[uVar12];
      if (cVar1 != ' ') {
        iVar3 = (int)uVar12;
        if (cVar1 == 'g') {
          if ((5 < end_offset - iVar3) &&
             (bVar2 = StringUtils::IsEqual<char>(content + uVar12,"group",5), bVar2)) {
            uVar12 = (ulong)(iVar3 + 5);
            local_48 = 4;
            break;
          }
        }
        else if (cVar1 == 's') {
          if (3 < end_offset - iVar3) {
            bVar2 = StringUtils::IsEqual<char>(content + uVar12,"set",3);
            if (bVar2) {
              uVar12 = (ulong)(iVar3 + 3);
              local_48 = 1;
              break;
            }
            if ((local_40 != iVar3) &&
               (bVar2 = StringUtils::IsEqual<char>(content + uVar12,"sort",4), bVar2)) {
              uVar12 = (ulong)(iVar3 + 4);
              local_48 = 3;
              break;
            }
          }
        }
        else {
          if (cVar1 != 'v') {
            uVar14 = iVar3 + 1;
            goto LAB_0010f6ff;
          }
          if ((5 < end_offset - iVar3) &&
             (bVar2 = StringUtils::IsEqual<char>(content + uVar12,"value",5), bVar2)) {
            uVar12 = (ulong)(iVar3 + 5);
            local_48 = 2;
            break;
          }
        }
        uVar12 = (ulong)(iVar3 + 1);
        break;
      }
    }
    uVar4 = uVar12 & 0xffffffff;
    uVar13 = uVar12 & 0xffffffff;
    if ((uint)uVar12 <= end_offset) {
      uVar13 = (ulong)end_offset;
    }
    for (; uVar11 = (uint)uVar13, uVar4 < uVar9; uVar4 = uVar4 + 1) {
      if (content[uVar4] == '=') {
        uVar11 = (uint)uVar4;
        break;
      }
    }
    iVar3 = 0;
    uVar6 = uVar11;
    do {
      uVar6 = uVar6 + 1;
      uVar7 = uVar11 + 1 + iVar3;
      if (end_offset <= uVar7) {
        return;
      }
      iVar3 = iVar3 + 1;
    } while (content[uVar7] == ' ');
    uVar8 = uVar11 + 1 + iVar3;
    uVar12 = (ulong)uVar6;
    do {
      uVar12 = uVar12 + 1;
      uVar14 = end_offset - 1;
      SVar5 = end_offset;
      if (uVar9 <= uVar12) break;
      SVar5 = uVar6 + 1;
      uVar14 = uVar6;
      uVar6 = SVar5;
    } while (content[uVar12] != content[uVar7]);
    bVar10 = (byte)uVar11;
    cVar1 = (char)iVar3;
    switch(local_48) {
    case 1:
      (tag->Set).Offset = uVar8;
      (tag->Set).Length = ((short)SVar5 + ~(ushort)uVar11) - (short)iVar3;
      checkLoopVariable(content,&tag->Set,tag->Parent);
      break;
    case 2:
      tag->ValueOffset = ((bVar10 + cVar1) - (char)tag->Offset) + '\x01';
      tag->ValueLength = ((char)SVar5 + ~bVar10) - cVar1;
      break;
    case 3:
      tag->Options = tag->Options | (content[uVar8] != 'a') * '\x02' + 2U;
      break;
    case 4:
      tag->GroupOffset = ((bVar10 + cVar1) - (char)tag->Offset) + '\x01';
      tag->GroupLength = ((char)SVar5 + ~bVar10) - cVar1;
    }
    uVar14 = uVar14 + 2;
LAB_0010f6ff:
    if (end_offset <= uVar14) {
      return;
    }
  } while( true );
}

Assistant:

inline static void parseLoopAttributes(const Char_T *content, const SizeT end_offset, LoopTag &tag) noexcept {
        enum struct LoopAttributes : SizeT8 { None = 0, Set, Value, Sort, Group };
        SizeT offset = (tag.Offset + TagPatterns::LoopPrefixLength);

        LoopAttributes att_type = LoopAttributes::None;

        do {
            while ((offset < end_offset) && (content[offset] == TagPatterns::SpaceChar)) {
                ++offset;
            }

            if (offset < end_offset) {
                switch (content[offset]) {
                    case TagPatterns::SetSortChar: {
                        const SizeT tmp_length = (end_offset - offset);

                        if ((tmp_length > TagPatterns::SetLength) &&
                            StringUtils::IsEqual((content + offset), TagPatterns::Set, TagPatterns::SetLength)) {
                            offset += TagPatterns::SetLength;
                            att_type = LoopAttributes::Set;
                            break;
                        }

                        if ((tmp_length > TagPatterns::SortLength) &&
                            StringUtils::IsEqual((content + offset), TagPatterns::Sort, TagPatterns::SortLength)) {
                            offset += TagPatterns::SortLength;
                            att_type = LoopAttributes::Sort;
                            break;
                        }

                        ++offset;
                        break;
                    }

                    case TagPatterns::ValueChar: {
                        if (((end_offset - offset) > TagPatterns::ValueLength) &&
                            StringUtils::IsEqual((content + offset), TagPatterns::Value, TagPatterns::ValueLength)) {
                            offset += TagPatterns::ValueLength;
                            att_type = LoopAttributes::Value;
                            break;
                        }

                        ++offset;
                        break;
                    }

                    case TagPatterns::GroupChar: {
                        if (((end_offset - offset) > TagPatterns::GroupLength) &&
                            StringUtils::IsEqual((content + offset), TagPatterns::Group, TagPatterns::GroupLength)) {
                            offset += TagPatterns::GroupLength;
                            att_type = LoopAttributes::Group;
                            break;
                        }

                        ++offset;
                        break;
                    }

                    default: {
                        ++offset;
                        continue;
                    }
                }
            }

            while ((offset < end_offset) && (content[offset] != TagPatterns::EqualChar)) {
                ++offset;
            }

            do {
                ++offset;
            } while ((offset < end_offset) && (content[offset] == TagPatterns::SpaceChar));

            if (offset < end_offset) {
                const SizeT  att_offset = (offset + SizeT{1});
                const Char_T quote_char = content[offset];

                do {
                    ++offset;
                } while ((offset < end_offset) && (content[offset] != quote_char));

                switch (att_type) {
                    case LoopAttributes::Set: {
                        tag.Set.Offset = att_offset;
                        tag.Set.Length = SizeT16(offset - att_offset);
                        checkLoopVariable(content, tag.Set, tag.Parent);
                        break;
                    }

                    case LoopAttributes::Value: {
                        tag.ValueOffset = SizeT8(att_offset - tag.Offset);
                        tag.ValueLength = SizeT8(offset - att_offset);
                        break;
                    }

                    case LoopAttributes::Sort: {
                        tag.Options |=
                            ((content[att_offset] == 'a') ? LoopTagOptions::SortAscend : LoopTagOptions::SortDescend);
                        break;
                    }

                    case LoopAttributes::Group: {
                        tag.GroupOffset = SizeT8(att_offset - tag.Offset);
                        tag.GroupLength = SizeT8(offset - att_offset);
                        break;
                    }

                    default: {
                    }
                }

                ++offset;
            }
        } while (offset < end_offset);
    }